

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

pair<double,_double> __thiscall HPresolve::getImpliedRowBounds(HPresolve *this,int row)

{
  reference pvVar1;
  reference pvVar2;
  pair<double,_double> pVar3;
  int k_1;
  int k;
  int col;
  double h;
  double g;
  double *in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  int local_3c;
  int local_38;
  
  pvVar1 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,
                      (size_type)in_stack_ffffffffffffff88);
  for (local_38 = *pvVar1;
      pvVar1 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,
                          (size_type)in_stack_ffffffffffffff88), local_38 < *pvVar1;
      local_38 = local_38 + 1) {
    std::vector<int,_std::allocator<int>_>::at
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,
               (size_type)in_stack_ffffffffffffff88);
    pvVar1 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,
                        (size_type)in_stack_ffffffffffffff88);
    if (*pvVar1 != 0) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      if (0.0 < *pvVar2 || *pvVar2 == 0.0) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
        if (*pvVar2 <= -1e+200) break;
        std::vector<double,_std::allocator<double>_>::at
                  (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
        std::vector<double,_std::allocator<double>_>::at
                  (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      }
      else {
        pvVar2 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
        if (1e+200 < *pvVar2 || *pvVar2 == 1e+200) break;
        std::vector<double,_std::allocator<double>_>::at
                  (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
        std::vector<double,_std::allocator<double>_>::at
                  (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      }
    }
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,
                      (size_type)in_stack_ffffffffffffff88);
  for (local_3c = *pvVar1;
      pvVar1 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,
                          (size_type)in_stack_ffffffffffffff88), local_3c < *pvVar1;
      local_3c = local_3c + 1) {
    std::vector<int,_std::allocator<int>_>::at
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,
               (size_type)in_stack_ffffffffffffff88);
    pvVar1 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,
                        (size_type)in_stack_ffffffffffffff88);
    if (*pvVar1 != 0) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      if (0.0 < *pvVar2 || *pvVar2 == 0.0) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
        if (1e+200 < *pvVar2 || *pvVar2 == 1e+200) break;
        pvVar2 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
        in_stack_ffffffffffffff88 = (double *)*pvVar2;
        std::vector<double,_std::allocator<double>_>::at
                  (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      }
      else {
        pvVar2 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
        if (*pvVar2 <= -1e+200) break;
        pvVar2 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
        in_stack_ffffffffffffff90 = (vector<double,_std::allocator<double>_> *)*pvVar2;
        std::vector<double,_std::allocator<double>_>::at
                  (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      }
    }
  }
  pVar3 = std::make_pair<double&,double&>
                    ((double *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return pVar3;
}

Assistant:

pair<double, double> HPresolve::getImpliedRowBounds(int row) {
	double g=0;
	double h=0;

	int col;
	for (int k = ARstart.at(row); k<ARstart.at(row+1); ++k) {
		col = ARindex.at(k);
		if (flagCol.at(col)) {
			if (ARvalue.at(k) < 0) {
				if (colUpper.at(col) < HSOL_CONST_INF)
					g+= ARvalue.at(k)*colUpper.at(col);
				else {
					g = -HSOL_CONST_INF;
					break;
				}
			}
			else {
				if (colLower.at(col) > -HSOL_CONST_INF)
					g+= ARvalue.at(k)*colLower.at(col);
				else {
					g = -HSOL_CONST_INF;
					break;
				}
			}
		}
	}

	for (int k = ARstart.at(row); k<ARstart.at(row+1); ++k) {
		col = ARindex.at(k);
		if (flagCol.at(col)) {
			if (ARvalue.at(k) < 0) {
				if (colLower.at(col) > -HSOL_CONST_INF)
					h+= ARvalue.at(k)*colLower.at(col);
				else {
					h = HSOL_CONST_INF;
					break;
				}

			}
			else {
				if (colUpper.at(col) < HSOL_CONST_INF)
					h+= ARvalue.at(k)*colUpper.at(col);
				else {
					h = HSOL_CONST_INF;
					break;
				}
			}
		}
	}
	return make_pair(g, h);
}